

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O2

int Curl_cert_hostcheck(char *match_pattern,char *hostname)

{
  _Bool _Var1;
  int iVar2;
  char *__s;
  char *__s_00;
  size_t sVar3;
  char *pcVar4;
  char *first;
  char *pcVar5;
  uint uVar6;
  size_t max;
  bool bVar7;
  
  if (match_pattern == (char *)0x0) {
    return 0;
  }
  if (hostname == (char *)0x0) {
    return 0;
  }
  if (*match_pattern == '\0') {
    return 0;
  }
  if (*hostname == '\0') {
    return 0;
  }
  __s = (*Curl_cstrdup)(match_pattern);
  if (__s == (char *)0x0) {
    return 0;
  }
  __s_00 = (*Curl_cstrdup)(hostname);
  if (__s_00 == (char *)0x0) {
    uVar6 = 0;
    goto LAB_0011f31c;
  }
  sVar3 = strlen(__s_00);
  if (__s_00[sVar3 - 1] == '.') {
    __s_00[sVar3 - 1] = '\0';
  }
  sVar3 = strlen(__s);
  if (__s[sVar3 - 1] == '.') {
    __s[sVar3 - 1] = '\0';
  }
  pcVar4 = strchr(__s,0x2a);
  if (pcVar4 == (char *)0x0) {
LAB_0011f2fd:
    iVar2 = Curl_strcasecompare(__s,__s_00);
LAB_0011f308:
    bVar7 = iVar2 != 0;
  }
  else {
    _Var1 = Curl_host_is_ipnum(__s_00);
    if (!_Var1) {
      first = strchr(__s,0x2e);
      if ((((first == (char *)0x0) || (pcVar5 = strchr(first + 1,0x2e), first < pcVar4)) ||
          (pcVar5 == (char *)0x0)) || (iVar2 = Curl_strncasecompare(__s,"xn--",4), iVar2 != 0))
      goto LAB_0011f2fd;
      pcVar5 = strchr(__s_00,0x2e);
      if (((pcVar5 == (char *)0x0) || (iVar2 = Curl_strcasecompare(first,pcVar5), iVar2 == 0)) ||
         (((long)pcVar5 - (long)__s_00 < (long)first - (long)__s ||
          (iVar2 = Curl_strncasecompare(__s,__s_00,(long)pcVar4 - (long)__s), iVar2 == 0))))
      goto LAB_0011f2b6;
      max = (long)first - (long)(pcVar4 + 1);
      iVar2 = Curl_strncasecompare(pcVar4 + 1,pcVar5 + -max,max);
      goto LAB_0011f308;
    }
LAB_0011f2b6:
    bVar7 = false;
  }
  uVar6 = (uint)bVar7;
  (*Curl_cfree)(__s_00);
LAB_0011f31c:
  (*Curl_cfree)(__s);
  return uVar6;
}

Assistant:

int Curl_cert_hostcheck(const char *match_pattern, const char *hostname)
{
  int res = 0;
  if(!match_pattern || !*match_pattern ||
      !hostname || !*hostname) /* sanity check */
    ;
  else {
    char *matchp = strdup(match_pattern);
    if(matchp) {
      char *hostp = strdup(hostname);
      if(hostp) {
        if(hostmatch(hostp, matchp) == CURL_HOST_MATCH)
          res = 1;
        free(hostp);
      }
      free(matchp);
    }
  }

  return res;
}